

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view_reference.h
# Opt level: O2

word_type __thiscall
bv::internal::range_reference::operator_cast_to_unsigned_long(range_reference *this)

{
  word_type wVar1;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 uStack_8;
  
  local_18 = *(undefined8 *)this;
  local_10 = *(undefined8 *)(this + 8);
  uStack_8 = *(undefined8 *)(this + 0x10);
  wVar1 = const_range_reference::operator_cast_to_unsigned_long((const_range_reference *)&local_18);
  return wVar1;
}

Assistant:

explicit operator word_type() const {
                return word_type(const_range_reference<C>(*this));
            }